

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Server::BuryTheDead(Server *this)

{
  bool bVar1;
  reference ppCVar2;
  long lVar3;
  time_t tVar4;
  pointer piVar5;
  _Self local_40;
  const_iterator local_38;
  _List_node_base *local_30;
  Client *local_28;
  Client *client;
  _Self local_18;
  iterator it;
  Server *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Client*,std::allocator<Client*>>>(&this->clients);
  do {
    client = (Client *)std::end<std::__cxx11::list<Client*,std::allocator<Client*>>>(&this->clients)
    ;
    bVar1 = std::operator!=(&local_18,(_Self *)&client);
    if (!bVar1) {
      return;
    }
    ppCVar2 = std::_List_iterator<Client_*>::operator*(&local_18);
    local_28 = *ppCVar2;
    bVar1 = Client::Connected(local_28);
    if ((!bVar1) &&
       (((lVar3 = std::__cxx11::string::length(), lVar3 == 0 &&
         (lVar3 = std::__cxx11::string::length(), lVar3 == 0)) ||
        (lVar3 = local_28->closed_time, tVar4 = time((time_t *)0x0), lVar3 + 2 < tVar4)))) {
      piVar5 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                         (&local_28->impl);
      close(piVar5->sock);
      if (local_28 != (Client *)0x0) {
        (*local_28->_vptr_Client[2])();
      }
      std::_List_const_iterator<Client_*>::_List_const_iterator(&local_38,&local_18);
      local_30 = (_List_node_base *)
                 std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::erase
                           (&this->clients,local_38);
      local_18._M_node = local_30;
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(&this->clients);
      bVar1 = std::operator==(&local_18,&local_40);
      if (bVar1) {
        return;
      }
    }
    std::_List_iterator<Client_*>::operator++(&local_18);
  } while( true );
}

Assistant:

void Server::BuryTheDead()
{
	UTIL_IFOREACH(this->clients, it)
	{
		Client *client = *it;

		if (!client->Connected() && ((client->send_buffer.length() == 0 && client->recv_buffer.length() == 0) || client->closed_time + 2 < std::time(0)))
		{
#ifdef WIN32
			closesocket(client->impl->sock);
#else // WIN32
			close(client->impl->sock);
#endif // WIN32
			delete client;
			it = this->clients.erase(it);
			if (it == this->clients.end())
				break;
		}
	}
}